

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O3

void __thiscall Mutex::~Mutex(Mutex *this)

{
  MutexFactory *pMVar1;
  
  this->_vptr_Mutex = (_func_int **)&PTR__Mutex_0019afb8;
  if (this->isValid == true) {
    pMVar1 = MutexFactory::i();
    if (pMVar1->enabled == true) {
      (*pMVar1->destroyMutex)(this->handle);
    }
  }
  return;
}

Assistant:

Mutex::~Mutex()
{
	if (isValid)
	{
		MutexFactory::i()->DestroyMutex(handle);
	}
}